

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void load_vector_vector<QPDF::HPageOffsetEntry>
               (BitStream *bit_stream,int nitems1,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1,
               offset_in_HPageOffsetEntry_to_int nitems2,int bits_wanted,
               offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2)

{
  iterator __position;
  int i;
  ulong uVar1;
  ulong uVar2;
  type ii_1;
  undefined4 in_register_00000084;
  pointer pHVar3;
  vector<int,_std::allocator<int>_> *this;
  int iVar4;
  type ii;
  int local_54;
  BitStream *local_50;
  ulong local_48;
  size_t local_40;
  long local_38;
  
  i = (int)nitems2;
  local_38 = CONCAT44(in_register_00000084,bits_wanted);
  local_48 = (ulong)nitems1;
  local_40 = (size_t)i;
  uVar2 = 0;
  local_50 = bit_stream;
  while( true ) {
    if (nitems1 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems1);
    }
    if (uVar2 == local_48) {
      BitStream::skipToNextByte(local_50);
      return;
    }
    pHVar3 = (vec1->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = ((long)(vec1->
                   super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar1 < uVar2 || uVar1 - uVar2 == 0) break;
    iVar4 = -1;
    while (iVar4 = iVar4 + 1, iVar4 < pHVar3[uVar2].nshared_objects) {
      if (i < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
      }
      this = (vector<int,_std::allocator<int>_> *)((long)&pHVar3[uVar2].delta_nobjects + local_38);
      local_54 = BitStream::getBitsInt(local_50,local_40);
      __position._M_current =
           (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this,__position,&local_54);
      }
      else {
        *__position._M_current = local_54;
        (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      pHVar3 = (vec1->
               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = ((long)(vec1->
                     super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) *
              0x2e8ba2e8ba2e8ba3;
      if (uVar1 < uVar2 || uVar1 - uVar2 == 0) goto LAB_0021cc6d;
    }
    uVar2 = uVar2 + 1;
  }
LAB_0021cc6d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2);
}

Assistant:

static void
load_vector_vector(
    BitStream& bit_stream,
    int nitems1,
    std::vector<T>& vec1,
    int T::* nitems2,
    int bits_wanted,
    std::vector<int> T::* vec2)
{
    // nitems1 times, read nitems2 (from the ith element of vec1) items into the vec2 vector field
    // of the ith item of vec1.
    for (size_t i1 = 0; i1 < QIntC::to_size(nitems1); ++i1) {
        for (int i2 = 0; i2 < vec1.at(i1).*nitems2; ++i2) {
            (vec1.at(i1).*vec2).push_back(bit_stream.getBitsInt(QIntC::to_size(bits_wanted)));
        }
    }
    bit_stream.skipToNextByte();
}